

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_feature.c
# Opt level: O1

int cmd_feature_dep(yl_opt *yo,int posc)

{
  int iVar1;
  char *format;
  
  iVar1 = ly_out_new_file(_stdout,&yo->out);
  if (iVar1 == 0) {
    yo->out_stdout = '\x01';
    if (yo->interactive == '\0') {
      return 0;
    }
    if (posc != 0) {
      return 0;
    }
    if (yo->feature_print_all != '\0') {
      return 0;
    }
    format = "Missing modules to print.";
  }
  else {
    format = "Unable to print to the standard output.";
  }
  yl_log('\x01',format);
  return 1;
}

Assistant:

int
cmd_feature_dep(struct yl_opt *yo, int posc)
{
    if (ly_out_new_file(stdout, &yo->out)) {
        YLMSG_E("Unable to print to the standard output.");
        return 1;
    }
    yo->out_stdout = 1;

    if (yo->interactive && !yo->feature_print_all && !posc) {
        YLMSG_E("Missing modules to print.");
        return 1;
    }

    return 0;
}